

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O3

GuestArenaAllocator * __thiscall
DListBase<Memory::Recycler::GuestArenaAllocator,RealCount>::
PrependNode<Memory::HeapAllocator,char16_t_const*,Memory::IdleDecommitPageAllocator*,void(*)()>
          (DListBase<Memory::Recycler::GuestArenaAllocator,RealCount> *this,HeapAllocator *allocator
          ,char16_t *param1,IdleDecommitPageAllocator *param2,_func_void *param3)

{
  long lVar1;
  HeapAllocator *alloc;
  long *plVar2;
  undefined1 local_68 [8];
  TrackAllocData data;
  
  local_68 = (undefined1  [8])&DListNode<Memory::Recycler::GuestArenaAllocator>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_120a8f;
  data.filename._0_4_ = 0x131;
  data._32_8_ = param3;
  alloc = Memory::HeapAllocator::TrackAllocInfo(allocator,(TrackAllocData *)local_68);
  plVar2 = (long *)new<Memory::HeapAllocator>(0x98,alloc,0x20260a);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)(plVar2 + 2),
             param1,&param2->super_PageAllocator,(_func_void *)data._32_8_,
             JsUtil::ExternalApi::RecoverUnusedMemory);
  *(undefined1 *)(plVar2 + 0x12) = 0;
  lVar1 = *(long *)this;
  plVar2[1] = *(long *)(lVar1 + 8);
  *plVar2 = lVar1;
  **(undefined8 **)(lVar1 + 8) = plVar2;
  *(long **)(lVar1 + 8) = plVar2;
  *(int *)(this + 0x10) = *(int *)(this + 0x10) + 1;
  return (GuestArenaAllocator *)(plVar2 + 2);
}

Assistant:

TData * PrependNode(TAllocator * allocator, TParam1 param1, TParam2 param2, TParam3 param3)
    {
        Node * newNode = AllocatorNew(TAllocator, allocator, Node, param1, param2, param3);
        if (newNode)
        {
            DListBase::InsertNodeBefore(this->Next(), newNode);
            this->IncrementCount();
            return &newNode->data;
        }
        return nullptr;
    }